

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

optional<cmGlobalGenerator::FrameworkDescriptor> * __thiscall
cmGlobalGenerator::SplitFrameworkPath
          (optional<cmGlobalGenerator::FrameworkDescriptor> *__return_storage_ptr__,
          cmGlobalGenerator *this,string *path,FrameworkFormat format)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  string local_348;
  string local_328;
  FrameworkDescriptor local_308;
  string local_2a8;
  undefined1 local_288 [8];
  string name_1;
  string fwDir;
  string local_228;
  string local_208;
  FrameworkDescriptor local_1e8;
  string local_188;
  string local_168;
  FrameworkDescriptor local_148;
  string_view local_e0;
  string_view local_d0;
  undefined4 local_c0;
  string local_b8;
  undefined1 local_98 [8];
  string libname;
  string name;
  string ext;
  FrameworkFormat format_local;
  string *path_local;
  cmGlobalGenerator *this_local;
  
  if ((SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)::
       frameworkPath == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                                   ::frameworkPath), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&SplitFrameworkPath::frameworkPath,
               "((.+)/)?(.+)\\.framework(/Versions/[^/]+)?(/(.+))?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&SplitFrameworkPath::frameworkPath,
                 &__dso_handle);
    __cxa_guard_release(&SplitFrameworkPath(std::__cxx11::string_const&,cmGlobalGenerator::FrameworkFormat)
                         ::frameworkPath);
  }
  cmsys::SystemTools::GetFilenameLastExtension((string *)((long)&name.field_2 + 8),path);
  uVar3 = std::__cxx11::string::empty();
  if (((((uVar3 & 1) == 0) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&name.field_2 + 8),".tbd"), !bVar1)) &&
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&name.field_2 + 8),".framework"), !bVar1)) ||
     (bVar1 = cmsys::RegularExpression::find(&SplitFrameworkPath::frameworkPath,path), !bVar1)) {
    if (format == Extended) {
      cmsys::SystemTools::GetParentDirectory((string *)((long)&name_1.field_2 + 8),path);
      cmsys::SystemTools::GetFilenameLastExtension(&local_2a8,path);
      bVar1 = std::operator==(&local_2a8,".framework");
      if (bVar1) {
        cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_288,path);
      }
      else {
        cmsys::SystemTools::GetFilenameName((string *)local_288,path);
      }
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::string((string *)&local_328,(string *)(name_1.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::string((string *)&local_348,(string *)local_288);
      FrameworkDescriptor::FrameworkDescriptor(&local_308,&local_328,&local_348);
      std::optional<cmGlobalGenerator::FrameworkDescriptor>::
      optional<cmGlobalGenerator::FrameworkDescriptor,_true>(__return_storage_ptr__,&local_308);
      FrameworkDescriptor::~FrameworkDescriptor(&local_308);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_328);
      local_c0 = 1;
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
    }
    else {
      std::optional<cmGlobalGenerator::FrameworkDescriptor>::optional(__return_storage_ptr__);
      local_c0 = 1;
    }
    goto LAB_0072f6bf;
  }
  cmsys::RegularExpression::match_abi_cxx11_
            ((string *)((long)&libname.field_2 + 8),&SplitFrameworkPath::frameworkPath,3);
  cmsys::RegularExpression::match_abi_cxx11_(&local_b8,&SplitFrameworkPath::frameworkPath,6);
  cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if ((format == Strict) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    std::optional<cmGlobalGenerator::FrameworkDescriptor>::optional(__return_storage_ptr__);
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_d0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      local_e0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)(libname.field_2._M_local_buf + 8));
      bVar1 = cmHasPrefix(local_d0,local_e0);
      if (!bVar1) {
        std::optional<cmGlobalGenerator::FrameworkDescriptor>::optional(__return_storage_ptr__);
        goto LAB_0072f4a7;
      }
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      lVar4 = std::__cxx11::string::size();
      lVar5 = std::__cxx11::string::size();
      if (lVar4 != lVar5) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_208,&SplitFrameworkPath::frameworkPath,2);
        std::__cxx11::string::string
                  ((string *)&local_228,(string *)(libname.field_2._M_local_buf + 8));
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)((long)&fwDir.field_2 + 8),(ulong)local_98);
        FrameworkDescriptor::FrameworkDescriptor
                  (&local_1e8,&local_208,&local_228,(string *)((long)&fwDir.field_2 + 8));
        std::optional<cmGlobalGenerator::FrameworkDescriptor>::
        optional<cmGlobalGenerator::FrameworkDescriptor,_true>(__return_storage_ptr__,&local_1e8);
        FrameworkDescriptor::~FrameworkDescriptor(&local_1e8);
        std::__cxx11::string::~string((string *)(fwDir.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_208);
        goto LAB_0072f4a7;
      }
    }
    cmsys::RegularExpression::match_abi_cxx11_(&local_168,&SplitFrameworkPath::frameworkPath,2);
    std::__cxx11::string::string((string *)&local_188,(string *)(libname.field_2._M_local_buf + 8));
    FrameworkDescriptor::FrameworkDescriptor(&local_148,&local_168,&local_188);
    std::optional<cmGlobalGenerator::FrameworkDescriptor>::
    optional<cmGlobalGenerator::FrameworkDescriptor,_true>(__return_storage_ptr__,&local_148);
    FrameworkDescriptor::~FrameworkDescriptor(&local_148);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
  }
LAB_0072f4a7:
  local_c0 = 1;
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(libname.field_2._M_local_buf + 8));
LAB_0072f6bf:
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGlobalGenerator::FrameworkDescriptor>
cmGlobalGenerator::SplitFrameworkPath(const std::string& path,
                                      FrameworkFormat format) const
{
  // Check for framework structure:
  //    (/path/to/)?FwName.framework
  // or (/path/to/)?FwName.framework/FwName(.tbd)?
  // or (/path/to/)?FwName.framework/Versions/*/FwName(.tbd)?
  static cmsys::RegularExpression frameworkPath(
    "((.+)/)?(.+)\\.framework(/Versions/[^/]+)?(/(.+))?$");

  auto ext = cmSystemTools::GetFilenameLastExtension(path);
  if ((ext.empty() || ext == ".tbd" || ext == ".framework") &&
      frameworkPath.find(path)) {
    auto name = frameworkPath.match(3);
    auto libname =
      cmSystemTools::GetFilenameWithoutExtension(frameworkPath.match(6));
    if (format == FrameworkFormat::Strict && libname.empty()) {
      return cm::nullopt;
    }
    if (!libname.empty() && !cmHasPrefix(libname, name)) {
      return cm::nullopt;
    }

    if (libname.empty() || name.size() == libname.size()) {
      return FrameworkDescriptor{ frameworkPath.match(2), name };
    }

    return FrameworkDescriptor{ frameworkPath.match(2), name,
                                libname.substr(name.size()) };
  }

  if (format == FrameworkFormat::Extended) {
    // path format can be more flexible: (/path/to/)?fwName(.framework)?
    auto fwDir = cmSystemTools::GetParentDirectory(path);
    auto name = cmSystemTools::GetFilenameLastExtension(path) == ".framework"
      ? cmSystemTools::GetFilenameWithoutExtension(path)
      : cmSystemTools::GetFilenameName(path);

    return FrameworkDescriptor{ fwDir, name };
  }

  return cm::nullopt;
}